

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O2

void duckdb::TestVectorTypesFun::RegisterFunction(BuiltinFunctions *set)

{
  mapped_type *this;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_3f1;
  key_type local_3f0;
  LogicalType local_3d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b8;
  string local_3a0;
  TableFunction test_vector_types;
  TableFunction local_1c8;
  
  ::std::__cxx11::string::string((string *)&local_3a0,"test_vector_types",(allocator *)&local_3d0);
  LogicalType::LogicalType((LogicalType *)&local_3f0,ANY);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_3f0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3b8,__l,&local_3f1);
  TableFunction::TableFunction
            (&test_vector_types,&local_3a0,(vector<duckdb::LogicalType,_true> *)&local_3b8,
             TestVectorTypesFunction,TestVectorTypesBind,TestVectorTypesInit,
             (table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b8);
  LogicalType::~LogicalType((LogicalType *)&local_3f0);
  ::std::__cxx11::string::~string((string *)&local_3a0);
  LogicalType::LogicalType((LogicalType *)&local_3f0,ANY);
  LogicalType::operator=
            (&test_vector_types.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs,
             (LogicalType *)&local_3f0);
  LogicalType::~LogicalType((LogicalType *)&local_3f0);
  LogicalType::LogicalType(&local_3d0,BOOLEAN);
  ::std::__cxx11::string::string((string *)&local_3f0,"all_flat",(allocator *)&local_3f1);
  this = ::std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)&test_vector_types.super_SimpleNamedParameterFunction.named_parameters,
                      &local_3f0);
  LogicalType::operator=(this,&local_3d0);
  ::std::__cxx11::string::~string((string *)&local_3f0);
  LogicalType::~LogicalType(&local_3d0);
  TableFunction::TableFunction(&local_1c8,&test_vector_types);
  BuiltinFunctions::AddFunction(set,&local_1c8);
  TableFunction::~TableFunction(&local_1c8);
  TableFunction::~TableFunction(&test_vector_types);
  return;
}

Assistant:

void TestVectorTypesFun::RegisterFunction(BuiltinFunctions &set) {
	TableFunction test_vector_types("test_vector_types", {LogicalType::ANY}, TestVectorTypesFunction,
	                                TestVectorTypesBind, TestVectorTypesInit);
	test_vector_types.varargs = LogicalType::ANY;
	test_vector_types.named_parameters["all_flat"] = LogicalType::BOOLEAN;

	set.AddFunction(std::move(test_vector_types));
}